

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O3

void ft::swap<int,ft::allocator<int>>
               (list<int,_ft::allocator<int>_> *x,list<int,_ft::allocator<int>_> *y)

{
  node *pnVar1;
  size_type sVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"list swap",9);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  pnVar1 = x->m_head;
  x->m_head = y->m_head;
  y->m_head = pnVar1;
  pnVar1 = x->m_tail;
  x->m_tail = y->m_tail;
  y->m_tail = pnVar1;
  sVar2 = x->m_size;
  x->m_size = y->m_size;
  y->m_size = sVar2;
  return;
}

Assistant:

void swap(list<T, Alloc> & x, list<T, Alloc> & y) {
	std::cout << "list swap" << std::endl;
	x.swap(y);
}